

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Warfare_Header.cpp
# Opt level: O2

void __thiscall KDIS::PDU::Warfare_Header::Encode(Warfare_Header *this,KDataStream *stream)

{
  Header7::Encode(&this->super_Header,stream);
  (*(this->m_FiringEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_FiringEntityID,stream);
  (*(this->m_TargetEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_TargetEntityID,stream);
  (*(this->m_MunitionID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_MunitionID,stream);
  (*(this->m_EventID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_EventID,stream);
  return;
}

Assistant:

void Warfare_Header::Encode( KDataStream & stream ) const
{
    Header::Encode( stream );
    stream << KDIS_STREAM m_FiringEntityID
           << KDIS_STREAM m_TargetEntityID
           << KDIS_STREAM m_MunitionID
           << KDIS_STREAM m_EventID;
}